

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

Value * __thiscall
GlobOpt::OptSrc(GlobOpt *this,Opnd *opnd,Instr **pInstr,Value **indirIndexValRef,
               IndirOpnd *parentIndirOpnd)

{
  char cVar1;
  OpCode OVar2;
  ulong uVar3;
  Loop *loop;
  SymIdToInstrMap *this_00;
  code *pcVar4;
  Instr **ppIVar5;
  IndirOpnd *pIVar6;
  bool bVar7;
  OpndKind OVar8;
  BOOLEAN BVar9;
  ArgSlot AVar10;
  ValueType valueType_00;
  ObjectType OVar11;
  ObjectType OVar12;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar13;
  int32 intConst;
  uint sourceContextId;
  uint functionId;
  undefined4 *puVar14;
  Value *pVVar15;
  PropertySym *pPVar16;
  JITTimeFunctionBody *pJVar17;
  FunctionJITTimeInfo *this_01;
  Value *pVVar18;
  PropertySym *pPVar19;
  StackSym *this_02;
  JITTimeProfileInfo *this_03;
  PropertySymOpnd *pPVar20;
  ProfiledInstr *pPVar21;
  IndirOpnd *pIVar22;
  RegOpnd *pRVar23;
  SymOpnd *pSVar24;
  Instr *pIVar25;
  anon_union_2_4_ea848c7b_for_ValueType_13 aVar26;
  BasicBlock *pBVar27;
  ValueType *pVVar28;
  SymID *key;
  byte bVar29;
  Instr *local_68;
  GlobOpt *local_60;
  PropertySym *local_58;
  undefined8 uStack_50;
  Instr **local_48;
  IndirOpnd *local_40;
  Opnd *opnd_local;
  ValueType profiledArrayType;
  ValueType valueType;
  
  local_40 = (IndirOpnd *)opnd;
  if ((indirIndexValRef != (Value **)0x0) && (*indirIndexValRef != (Value *)0x0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd07,"(!indirIndexValRef || !*indirIndexValRef)",
                       "!indirIndexValRef || !*indirIndexValRef");
    if (!bVar7) goto LAB_00450855;
    *puVar14 = 0;
  }
  if (parentIndirOpnd == (IndirOpnd *)0x0) {
    pIVar25 = *pInstr;
    if (((local_40 != (IndirOpnd *)pIVar25->m_src1) && (local_40 != (IndirOpnd *)pIVar25->m_src2))
       && ((local_40 != (IndirOpnd *)pIVar25->m_dst ||
           (OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd), OVar8 != OpndKindIndir))))
    goto LAB_0044f360;
  }
  else if ((local_40 != (IndirOpnd *)parentIndirOpnd->m_baseOpnd) &&
          (local_40 != (IndirOpnd *)parentIndirOpnd->m_indexOpnd)) {
LAB_0044f360:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar14 = 1;
    bVar7 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0xd0b,
                       "(parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd())"
                       ,
                       "parentIndirOpnd ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd() : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd()"
                      );
    if (!bVar7) goto LAB_00450855;
    *puVar14 = 0;
  }
  local_48 = pInstr;
  OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
  pIVar6 = local_40;
  pVVar15 = (Value *)0x0;
  switch(OVar8) {
  case OpndKindIntConst:
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindIntConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    intConst = IR::IntConstOpnd::AsInt32((IntConstOpnd *)pIVar6);
LAB_0044f455:
    pIVar25 = *local_48;
LAB_0044f461:
    pVVar15 = GetIntConstantValue(this,intConst,pIVar25,(Opnd *)0x0);
    break;
  case OpndKindInt64Const:
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindInt64Const) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0xe4,"(this->IsInt64ConstOpnd())","Bad call to AsInt64ConstOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    pVVar15 = GetIntConstantValue(this,(int64)pIVar6->m_baseOpnd,*local_48,(Opnd *)0x0);
    break;
  case OpndKindFloatConst:
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindFloatConst) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x107,"(this->IsFloatConstOpnd())","Bad call to AsFloatConstOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    ppIVar5 = local_48;
    pPVar19 = (PropertySym *)pIVar6->m_baseOpnd;
    if (((double)pPVar19 == (double)(int)(double)pPVar19) &&
       (!NAN((double)pPVar19) && !NAN((double)(int)(double)pPVar19))) {
      uStack_50 = 0;
      local_58 = pPVar19;
      bVar7 = Js::NumberUtilities::IsSpecial((double)pPVar19,0x8000000000000000);
      pPVar19 = local_58;
      if (bVar7) goto LAB_0044f744;
      intConst = (int32)(double)local_58;
      pIVar25 = *ppIVar5;
      goto LAB_0044f461;
    }
LAB_0044f744:
    pVVar15 = NewFloatConstantValue(this,(FloatConstType)pPVar19,(Opnd *)0x0);
    break;
  default:
    goto switchD_0044f3e0_caseD_4;
  case OpndKindSym:
    pVVar28 = &ValueType::Uninitialized;
    IR::Opnd::SetValueType(&local_40->super_Opnd,(ValueType)0x9);
    pIVar6 = local_40;
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindSym) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    ppIVar5 = local_48;
    pPVar19 = (PropertySym *)pIVar6->m_baseOpnd;
    if ((pPVar19->super_Sym).m_kind == SymKindStack) {
      if (((pPVar19->m_propertyId & 0x100000) != 0) &&
         (*(short *)&(pPVar19->super_Sym).field_0x16 == 0)) {
        AssertCount = AssertCount + 1;
        local_58 = pPVar19;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
        pPVar19 = local_58;
      }
      if ((pPVar19->m_propertyId & 0x100000) != 0) goto LAB_00450294;
    }
    if (((pPVar19->super_Sym).m_kind == SymKindStack) && ((pPVar19->m_propertyId & 0x400000) != 0))
    {
      bVar7 = JITTimeWorkItem::IsLoopBody((*ppIVar5)->m_func->m_workItem);
      if (!bVar7) {
        pJVar17 = JITTimeWorkItem::GetJITFunctionBody((*local_48)->m_func->m_workItem);
        bVar7 = JITTimeFunctionBody::HasProfileInfo(pJVar17);
        if (bVar7) {
          this_02 = Sym::AsStackSym(&pPVar19->super_Sym);
          AVar10 = StackSym::GetParamSlotNum(this_02);
          if (1 < AVar10) {
            pJVar17 = JITTimeWorkItem::GetJITFunctionBody((*local_48)->m_func->m_workItem);
            this_03 = JITTimeFunctionBody::GetReadOnlyProfileInfo(pJVar17);
            valueType_00 = JITTimeProfileInfo::GetParameterInfo(this_03,AVar10 - 2);
            pVVar15 = NewGenericValue(this,valueType_00,(Opnd *)0x0);
            IR::Opnd::SetValueType
                      (&local_40->super_Opnd,
                       (ValueType)
                       *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                        &(pVVar15->valueInfo->super_ValueType).field_0.field_0);
            return pVVar15;
          }
        }
      }
    }
    else {
      if ((pPVar19->super_Sym).m_kind != SymKindProperty) {
        local_58 = (PropertySym *)0x0;
        goto LAB_0044fd59;
      }
      if ((pPVar19->super_Sym).m_kind != SymKindProperty) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x43,"(this->IsPropertySym())","Bad call to AsPropertySym()");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
      }
      if ((pPVar19->m_propertyId == 0x1cf) &&
         (pPVar16 = Sym::AsPropertySym(&pPVar19->super_Sym), (pPVar16->super_Sym).field_0x15 == '\0'
         )) {
        pSVar24 = IR::Opnd::AsSymOpnd(&local_40->super_Opnd);
        bVar7 = IR::SymOpnd::IsPropertySymOpnd(pSVar24);
        if (bVar7) {
          pIVar25 = *local_48;
LAB_0045023e:
          pPVar20 = IR::Opnd::AsPropertySymOpnd(&local_40->super_Opnd);
          FinishOptPropOp(this,pIVar25,pPVar20,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
          return (Value *)0x0;
        }
      }
      else {
        local_58 = pPVar19;
        pVVar15 = GlobOptBlockData::FindValue
                            (&this->currentBlock->globOptData,&pPVar19->m_stackSym->super_Sym);
        pIVar6 = local_40;
        OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
        if (OVar8 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          local_60 = this;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar7) goto LAB_00450855;
          *puVar14 = 0;
          this = local_60;
        }
        pIVar22 = local_40;
        if (pVVar15 != (Value *)0x0) {
          pVVar28 = &pVVar15->valueInfo->super_ValueType;
        }
        *(anon_union_2_4_ea848c7b_for_ValueType_13 *)((long)&pIVar6->m_indexOpnd + 4) =
             pVVar28->field_0;
        OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
        if (OVar8 != OpndKindSym) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar14 = 1;
          bVar7 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
          if (!bVar7) goto LAB_00450855;
          *puVar14 = 0;
        }
        ppIVar5 = local_48;
        pPVar19 = CopyPropPropertySymObj(this,(SymOpnd *)pIVar22,*local_48);
        bVar7 = DoFieldCopyProp(this);
        if (bVar7) {
          pIVar25 = *ppIVar5;
          OVar2 = pIVar25->m_opcode;
          if (OVar2 < BrOnHasProperty) {
            if ((OVar2 - 0x80 < 0xc) && ((0xc4fU >> (OVar2 - 0x80 & 0x1f) & 1) != 0)) {
              return (Value *)0x0;
            }
            if (OVar2 == BrOnHasLocalProperty) {
              return (Value *)0x0;
            }
          }
          else {
            if ((OVar2 - 500 < 5) && ((0x13U >> (OVar2 - 500 & 0x1f) & 1) != 0)) {
              return (Value *)0x0;
            }
            if (OVar2 - 0x102 < 2) {
              return (Value *)0x0;
            }
            if (OVar2 == BrOnNoLocalProperty) {
              return (Value *)0x0;
            }
          }
          bVar7 = IR::Instr::CallsGetter(pIVar25);
          if (!bVar7) {
            if ((this->prePassLoop != (Loop *)0x0) &&
               (bVar7 = DoFieldPRE(this,this->rootLoopPrePass), bVar7)) {
              if (((this->prePassLoop->field_0x178 & 0x80) == 0) &&
                 (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                    (this->prePassLoop->fieldKilled,(pPVar19->super_Sym).m_id),
                 BVar9 == '\0')) {
                loop = this->rootLoopPrePass;
                pIVar25 = *local_48;
                pPVar16 = Sym::AsPropertySym(&pPVar19->super_Sym);
                SetLoopFieldInitialValue(this,loop,pIVar25,pPVar16,local_58);
              }
              bVar7 = IsPREInstrCandidateLoad((*local_48)->m_opcode);
              if (bVar7) {
                key = &(pPVar19->super_Sym).m_id;
                bVar7 = JsUtil::
                        BaseDictionary<unsigned_int,_IR::Instr_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                        ::ContainsKey(this->prePassInstrMap,key);
                if (!bVar7) {
                  this_00 = this->prePassInstrMap;
                  local_68 = IR::Instr::CopyWithoutDst(*local_48);
                  JsUtil::
                  BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  ::
                  Insert<(JsUtil::BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                            ((BaseDictionary<unsigned_int,IR::Instr*,Memory::JitArenaAllocator,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                              *)this_00,key,&local_68);
                }
              }
            }
            goto LAB_0044fd59;
          }
        }
        else {
          pSVar24 = IR::Opnd::AsSymOpnd(&local_40->super_Opnd);
          bVar7 = IR::SymOpnd::IsPropertySymOpnd(pSVar24);
          if (bVar7) {
            pIVar25 = *ppIVar5;
            goto LAB_0045023e;
          }
        }
      }
    }
    goto LAB_00450294;
  case OpndKindReg:
    IR::Opnd::SetValueType(&local_40->super_Opnd,(ValueType)0x9);
    pIVar6 = local_40;
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    pIVar22 = local_40;
    local_58 = (PropertySym *)pIVar6->m_baseOpnd;
    pBVar27 = this->currentBlock;
    pIVar25 = *local_48;
    local_60 = this;
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    GlobOptBlockData::MarkTempLastUse(&pBVar27->globOptData,pIVar25,(RegOpnd *)pIVar22);
    if ((local_58->super_Sym).m_kind != SymKindStack) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                         ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    pPVar19 = local_58;
    this = local_60;
    if ((local_58->m_propertyId & 0x10000) == 0) {
      local_58 = (PropertySym *)0x0;
    }
    else {
      if ((local_58->super_Sym).m_kind != SymKindStack) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
      }
      pPVar19 = (PropertySym *)StackSym::GetVarEquivSym((StackSym *)local_58,this->func);
      local_58 = (PropertySym *)0x0;
    }
LAB_0044fd59:
    pVVar15 = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,&pPVar19->super_Sym);
    ppIVar5 = local_48;
    if (pVVar15 == (Value *)0x0) {
      bVar7 = IR::Instr::TransfersSrcValue(*local_48);
      if ((bVar7) || (bVar7 = OpCodeAttr::CanCSE((*ppIVar5)->m_opcode), bVar7)) {
        if ((local_40 == (IndirOpnd *)(*ppIVar5)->m_src1) ||
           (local_40 == (IndirOpnd *)(*ppIVar5)->m_src2)) {
          if ((pPVar19->super_Sym).m_kind == SymKindProperty) {
            pPVar19 = Sym::AsPropertySym(&pPVar19->super_Sym);
            pVVar15 = CreateFieldSrcValue(this,pPVar19,local_58,(Opnd **)&local_40,*ppIVar5);
          }
          else {
            pVVar15 = NewGenericValue(this,(ValueType)0x9,&local_40->super_Opnd);
          }
        }
        else {
          pVVar15 = (Value *)0x0;
        }
      }
      else {
        pVVar15 = (Value *)0x0;
      }
    }
    else {
      local_60 = this;
      local_58 = pPVar19;
      bVar7 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,&pPVar19->super_Sym);
      if ((!bVar7) && ((local_58->super_Sym).m_kind != SymKindProperty)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xdc5,"(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()))",
                           "CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym())");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
      }
      this = local_60;
      if (*local_48 != (Instr *)0x0) {
        local_40 = (IndirOpnd *)
                   CopyProp(local_60,&local_40->super_Opnd,*local_48,pVVar15,parentIndirOpnd);
      }
      pPVar19 = local_58;
      if (local_40 == (IndirOpnd *)0x0) goto LAB_00450294;
      if (((((this->prePassLoop != (Loop *)0x0) && ((local_58->super_Sym).m_kind == SymKindStack))
           && (BVar9 = BVSparse<Memory::JitArenaAllocator>::Test
                                 (this->rootLoopPrePass->symsUsedBeforeDefined,
                                  (local_58->super_Sym).m_id), BVar9 == '\0')) &&
          ((bVar7 = GlobOptBlockData::IsLive
                              (&this->rootLoopPrePass->landingPad->globOptData,&pPVar19->super_Sym),
           bVar7 && ((this->field_0xf7 & 2) == 0)))) &&
         ((pVVar18 = GlobOptBlockData::FindValue
                               (&this->rootLoopPrePass->landingPad->globOptData,&local_58->super_Sym
                               ), pPVar19 = local_58, pVVar18 != (Value *)0x0 &&
          (pVVar15->valueNumber == pVVar18->valueNumber)))) {
        BVSparse<Memory::JitArenaAllocator>::Set
                  (this->rootLoopPrePass->symsUsedBeforeDefined,(local_58->super_Sym).m_id);
        pVVar28 = &pVVar18->valueInfo->super_ValueType;
        bVar7 = ValueType::IsLikelyNumber(pVVar28);
        if (bVar7) {
          BVSparse<Memory::JitArenaAllocator>::Set
                    (this->rootLoopPrePass->likelyNumberSymsUsedBeforeDefined,
                     (pPVar19->super_Sym).m_id);
          if ((this->field_0xf5 & 2) == 0) {
            bVar7 = ValueType::IsInt(pVVar28);
          }
          else {
            bVar7 = ValueType::IsLikelyInt(pVVar28);
          }
          if (bVar7 != false) {
            BVSparse<Memory::JitArenaAllocator>::Set
                      (this->rootLoopPrePass->likelyIntSymsUsedBeforeDefined,
                       (local_58->super_Sym).m_id);
          }
        }
      }
    }
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    pIVar6 = local_40;
    if (OVar8 == OpndKindSym) {
      OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
      if (OVar8 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
      }
      bVar7 = IR::SymOpnd::IsPropertySymOpnd((SymOpnd *)pIVar6);
      ppIVar5 = local_48;
      if (bVar7) {
        TryOptimizeInstrWithFixedDataProperty(this,local_48);
        pIVar25 = *ppIVar5;
        pPVar20 = IR::Opnd::AsPropertySymOpnd(&local_40->super_Opnd);
        FinishOptPropOp(this,pIVar25,pPVar20,(BasicBlock *)0x0,false,(bool *)0x0,(bool *)0x0);
      }
    }
    if (pVVar15 != (Value *)0x0) {
      opnd_local._6_2_ =
           (anon_union_2_4_ea848c7b_for_ValueType_13)
           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
            &(pVVar15->valueInfo->super_ValueType).field_0.field_0;
      bVar7 = ValueType::IsLikelyArray((ValueType *)((long)&opnd_local + 6));
      if (((bVar7) && (bVar7 = ValueType::IsDefinite((ValueType *)((long)&opnd_local + 6)), !bVar7))
         && ((bVar7 = ValueType::IsObject((ValueType *)((long)&opnd_local + 6)), !bVar7 &&
             ((*local_48)->m_kind == InstrKindProfiled)))) {
        pPVar21 = IR::Instr::AsProfiledInstr(*local_48);
        ValueType::ValueType((ValueType *)((long)&opnd_local + 4));
        pIVar25 = *local_48;
        OVar2 = pIVar25->m_opcode;
        bVar29 = 1;
        if (OVar2 < LdLen_A) {
          if (OVar2 == LdElemI_A) {
            OVar8 = IR::Opnd::GetKind(pIVar25->m_src1);
            pIVar6 = local_40;
            if ((OVar8 == OpndKindIndir) &&
               (pIVar22 = IR::Opnd::AsIndirOpnd((*local_48)->m_src1),
               pIVar6 == (IndirOpnd *)pIVar22->m_baseOpnd)) {
LAB_0045039b:
              opnd_local._4_2_ =
                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar21->u).ldElemInfo;
              bVar29 = ((anon_union_1_2_471f577c_for_LdElemInfo_3 *)
                       ((long)(pPVar21->u).ldElemInfo + 5))->bits & 4;
LAB_004503ab:
              bVar29 = bVar29 == 0;
            }
          }
          else if ((OVar2 == StElemI_A) || (OVar2 == StElemI_A_Strict)) {
LAB_004502d9:
            OVar8 = IR::Opnd::GetKind(pIVar25->m_dst);
            pIVar6 = local_40;
            if ((OVar8 == OpndKindIndir) &&
               (pIVar22 = IR::Opnd::AsIndirOpnd((*local_48)->m_dst),
               pIVar6 == (IndirOpnd *)pIVar22->m_baseOpnd)) {
              opnd_local._4_2_ =
                   *(anon_union_2_4_ea848c7b_for_ValueType_13 *)(pPVar21->u).stElemInfo;
              bVar29 = ((anon_union_1_2_471f577c_for_StElemInfo_2 *)
                       ((long)(pPVar21->u).stElemInfo + 3))->bits & 0x40;
              goto LAB_004503ab;
            }
          }
        }
        else if (OVar2 == LdLen_A) {
          OVar8 = IR::Opnd::GetKind(pIVar25->m_src1);
          if ((OVar8 == OpndKindReg) && (local_40 == (IndirOpnd *)(*local_48)->m_src1)) {
            opnd_local._4_2_ =
                 (anon_union_2_4_ea848c7b_for_ValueType_13)(pPVar21->u).field_3.ldLenInfoData.f1;
            bVar29 = *(byte *)((long)&pPVar21->u + 6) ^ 1;
          }
        }
        else if (OVar2 == IsIn) {
          OVar8 = IR::Opnd::GetKind(pIVar25->m_src2);
          if ((OVar8 == OpndKindReg) && (local_40 == (IndirOpnd *)(*local_48)->m_src2))
          goto LAB_0045039b;
        }
        else if (OVar2 == StElemC) goto LAB_004502d9;
        bVar7 = ValueType::IsLikelyObject((ValueType *)((long)&opnd_local + 4));
        if (bVar7) {
          if ((bVar29 & 1) == 0) {
LAB_004503fa:
            OVar11 = ValueType::GetObjectType((ValueType *)((long)&opnd_local + 4));
            OVar12 = ValueType::GetObjectType((ValueType *)((long)&opnd_local + 6));
            if ((OVar11 == OVar12) &&
               ((bVar7 = ValueType::IsLikelyNativeArray((ValueType *)((long)&opnd_local + 6)),
                !bVar7 || ((bVar7 = ValueType::HasVarElements((ValueType *)((long)&opnd_local + 4)),
                           !bVar7 && ((bVar7 = ValueType::HasIntElements
                                                         ((ValueType *)((long)&opnd_local + 6)),
                                      !bVar7 || (bVar7 = ValueType::HasFloatElements
                                                                   ((ValueType *)
                                                                    ((long)&opnd_local + 4)), !bVar7
                                                )))))))) goto LAB_0045074e;
            bVar7 = ValueType::IsLikelyArray((ValueType *)((long)&opnd_local + 4));
            aVar26 = opnd_local._4_2_;
            if (bVar7) {
              ValueType::Verify((ValueType)opnd_local._6_2_);
              ValueType::Verify((ValueType)aVar26.field_0);
              bVar7 = ValueType::operator==
                                ((ValueType *)((long)&opnd_local + 6),(ValueType)aVar26.field_0);
              aVar13 = opnd_local._6_2_;
              if (!bVar7) {
                ValueType::ValueType((ValueType *)&local_68,opnd_local._6_2_ | aVar26.bits);
                bVar7 = ValueType::OneOn((ValueType *)&local_68,Object);
                if (bVar7) {
                  aVar13.field_0 =
                       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ValueType::MergeWithObject
                                 ((ValueType *)((long)&opnd_local + 6),aVar26.field_0);
                }
                else {
                  aVar13.field_0 =
                       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ValueType::Verify(local_68._0_2_);
                }
              }
              local_68 = (Instr *)CONCAT62(local_68._2_6_,aVar13.bits);
              bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&opnd_local + 6));
              opnd_local._6_2_ =
                   (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                   ValueType::SetHasNoMissingValues((ValueType *)&local_68,bVar7);
            }
            else {
              ValueType::Verify((ValueType)opnd_local._6_2_);
              ValueType::Verify((ValueType)aVar26.field_0);
              bVar7 = ValueType::operator==
                                ((ValueType *)((long)&opnd_local + 6),(ValueType)aVar26.field_0);
              if (!bVar7) {
                ValueType::ValueType((ValueType *)&local_68,opnd_local._6_2_ | aVar26.bits);
                bVar7 = ValueType::OneOn((ValueType *)&local_68,Object);
                if (bVar7) {
                  opnd_local._6_2_ =
                       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ValueType::MergeWithObject
                                 ((ValueType *)((long)&opnd_local + 6),aVar26.field_0);
                }
                else {
                  opnd_local._6_2_ =
                       (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                       ValueType::Verify(local_68._0_2_);
                }
              }
            }
            pBVar27 = this->currentBlock;
            pRVar23 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
            pVVar18 = GlobOptBlockData::FindValue(&pBVar27->globOptData,&pRVar23->m_sym->super_Sym);
            bVar7 = true;
          }
          else {
            OVar11 = ValueType::GetObjectType((ValueType *)((long)&opnd_local + 4));
            OVar12 = ValueType::GetObjectType((ValueType *)((long)&opnd_local + 6));
            if (((OVar11 != OVar12) ||
                (bVar7 = ValueType::IsLikelyNativeIntArray((ValueType *)((long)&opnd_local + 6)),
                bVar7)) ||
               ((bVar7 = ValueType::HasIntElements((ValueType *)((long)&opnd_local + 4)), !bVar7 &&
                ((bVar7 = ValueType::HasVarElements((ValueType *)((long)&opnd_local + 6)), !bVar7 ||
                 (bVar7 = ValueType::HasFloatElements((ValueType *)((long)&opnd_local + 4)), !bVar7)
                 ))))) {
              if ((bVar29 & 1) != 0) goto LAB_0045074e;
              goto LAB_004503fa;
            }
            bVar7 = ValueType::HasNoMissingValues((ValueType *)((long)&opnd_local + 6));
            opnd_local._6_2_ =
                 (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
                 ValueType::SetHasNoMissingValues((ValueType *)((long)&opnd_local + 4),bVar7);
            pBVar27 = this->currentBlock;
            pRVar23 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
            pVVar18 = GlobOptBlockData::FindValue(&pBVar27->globOptData,&pRVar23->m_sym->super_Sym);
            bVar7 = false;
          }
          ChangeValueType(this,pBVar27,pVVar18,(ValueType)opnd_local._6_2_,false,bVar7);
        }
      }
LAB_0045074e:
      IR::Opnd::SetValueType(&local_40->super_Opnd,(ValueType)opnd_local._6_2_);
      if (this->prePassLoop != (Loop *)0x0) {
        return pVVar15;
      }
      OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
      if (OVar8 != OpndKindSym) {
        return pVVar15;
      }
      bVar7 = ValueType::IsDefinite((ValueType *)((long)&opnd_local + 6));
      if ((!bVar7) &&
         (bVar7 = ValueType::IsNotTaggedValue((ValueType *)((long)&opnd_local + 6)), !bVar7)) {
        return pVVar15;
      }
      pSVar24 = IR::Opnd::AsSymOpnd(&local_40->super_Opnd);
      if (pSVar24->m_sym->m_kind != SymKindProperty) {
        return pVVar15;
      }
      bVar7 = DoFieldCopyProp(this);
      if (!bVar7) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                           ,0xe5d,"(DoFieldCopyProp())","DoFieldCopyProp()");
        if (!bVar7) {
LAB_00450855:
          pcVar4 = (code *)invalidInstructionException();
          (*pcVar4)();
        }
        *puVar14 = 0;
      }
      CaptureNoImplicitCallUses(this,&local_40->super_Opnd,false,*local_48);
      return pVVar15;
    }
    aVar26.field_0 =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         (anon_union_2_4_ea848c7b_for_ValueType_13)0x9;
    pVVar15 = (Value *)0x0;
    goto LAB_0044fcad;
  case OpndKindAddr:
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindAddr) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x18e,"(this->IsAddrOpnd())","Bad call to AsAddrOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    ppIVar5 = local_48;
    if (((ulong)pIVar6->m_func & 2) == 0) {
      cVar1 = *(char *)((long)&pIVar6->m_func + 1);
      if ((cVar1 != '\n') && (cVar1 != '\x01')) {
LAB_0044fd35:
        pVVar15 = GetVarConstantValue(this,(AddrOpnd *)pIVar6);
        return pVVar15;
      }
      uVar3._0_4_ = pIVar6->m_offset;
      uVar3._4_1_ = pIVar6->m_scale;
      uVar3._5_1_ = pIVar6->m_conversionAllowed;
      uVar3._6_2_ = *(undefined2 *)&pIVar6->field_0x26;
      if ((uVar3 & 0x1ffff00000000) != 0x1000000000000 &&
          (uVar3 & 0xffff000000000000) == 0x1000000000000) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar14 = 1;
        bVar7 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/../Runtime/Language/TaggedInt.inl"
                           ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                           "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
        if (!bVar7) goto LAB_00450855;
        *puVar14 = 0;
      }
      if ((uVar3 & 0xffff000000000000) != 0x1000000000000) goto LAB_0044fd35;
      intConst = Js::TaggedInt::ToInt32(*(Var *)&pIVar6->m_offset);
      goto LAB_0044f455;
    }
    pJVar17 = JITTimeWorkItem::GetJITFunctionBody((*local_48)->m_func->m_workItem);
    sourceContextId = JITTimeFunctionBody::GetSourceContextId(pJVar17);
    this_01 = JITTimeWorkItem::GetJITTimeInfo((*ppIVar5)->m_func->m_workItem);
    functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_01);
    bVar7 = Js::Phases::IsEnabled
                      ((Phases *)&DAT_015bbe90,FixedMethodsPhase,sourceContextId,functionId);
    if (bVar7) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0xd30,
                         "(!Js::Configuration::Global.flags.Off.IsEnabled(((Js::FixedMethodsPhase)), ((instr->m_func)->GetSourceContextId()), ((instr->m_func)->GetLocalFunctionId())))"
                         ,"Fixed function address operand with fixed method calls phase disabled?");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    pVVar15 = NewFixedFunctionValue
                        (this,*(JavascriptFunction **)&pIVar6->m_offset,(AddrOpnd *)pIVar6);
    break;
  case OpndKindIndir:
    OVar8 = IR::Opnd::GetKind(&local_40->super_Opnd);
    if (OVar8 != OpndKindIndir) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar14 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar14 = 1;
      bVar7 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
      if (!bVar7) goto LAB_00450855;
      *puVar14 = 0;
    }
    OptimizeIndirUses(this,pIVar6,local_48,indirIndexValRef);
LAB_00450294:
    pVVar15 = (Value *)0x0;
    goto switchD_0044f3e0_caseD_4;
  }
  aVar26 = (anon_union_2_4_ea848c7b_for_ValueType_13)
           *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
            &(pVVar15->valueInfo->super_ValueType).field_0.field_0;
LAB_0044fcad:
  IR::Opnd::SetValueType(&local_40->super_Opnd,(ValueType)aVar26.field_0);
switchD_0044f3e0_caseD_4:
  return pVVar15;
}

Assistant:

Value*
GlobOpt::OptSrc(IR::Opnd *opnd, IR::Instr * *pInstr, Value **indirIndexValRef, IR::IndirOpnd *parentIndirOpnd)
{
    IR::Instr * &instr = *pInstr;
    Assert(!indirIndexValRef || !*indirIndexValRef);
    Assert(
        parentIndirOpnd
            ? opnd == parentIndirOpnd->GetBaseOpnd() || opnd == parentIndirOpnd->GetIndexOpnd()
            : opnd == instr->GetSrc1() || opnd == instr->GetSrc2() || opnd == instr->GetDst() && opnd->IsIndirOpnd());

    Sym *sym;
    Value *val;
    PropertySym *originalPropertySym = nullptr;

    switch(opnd->GetKind())
    {
    case IR::OpndKindIntConst:
        val = this->GetIntConstantValue(opnd->AsIntConstOpnd()->AsInt32(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindInt64Const:
        val = this->GetIntConstantValue(opnd->AsInt64ConstOpnd()->GetValue(), instr);
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    case IR::OpndKindFloatConst:
    {
        const FloatConstType floatValue = opnd->AsFloatConstOpnd()->m_value;
        int32 int32Value;
        if(Js::JavascriptNumber::TryGetInt32Value(floatValue, &int32Value))
        {
            val = GetIntConstantValue(int32Value, instr);
        }
        else
        {
            val = NewFloatConstantValue(floatValue);
        }
        opnd->SetValueType(val->GetValueInfo()->Type());
        return val;
    }

    case IR::OpndKindAddr:
        {
            IR::AddrOpnd *addrOpnd = opnd->AsAddrOpnd();
            if (addrOpnd->m_isFunction)
            {
                AssertMsg(!PHASE_OFF(Js::FixedMethodsPhase, instr->m_func), "Fixed function address operand with fixed method calls phase disabled?");
                val = NewFixedFunctionValue((Js::JavascriptFunction *)addrOpnd->m_address, addrOpnd);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            else if (addrOpnd->IsVar() && Js::TaggedInt::Is(addrOpnd->m_address))
            {
                val = this->GetIntConstantValue(Js::TaggedInt::ToInt32(addrOpnd->m_address), instr);
                opnd->SetValueType(val->GetValueInfo()->Type());
                return val;
            }
            val = this->GetVarConstantValue(addrOpnd);
            return val;
        }

    case IR::OpndKindSym:
    {
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsSymOpnd()->m_sym;

        // Don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsArgSlotSym())
        {
            return nullptr;
        }

        // Unless we have profile info, don't create a new value for ArgSlots and don't copy prop them away.
        if (sym->IsStackSym() && sym->AsStackSym()->IsParamSlotSym())
        {
            if (!instr->m_func->IsLoopBody() && instr->m_func->HasProfileInfo())
            {
                // Skip "this" pointer.
                int paramSlotNum = sym->AsStackSym()->GetParamSlotNum() - 2;
                if (paramSlotNum >= 0)
                {
                    const auto parameterType = instr->m_func->GetReadOnlyProfileInfo()->GetParameterInfo(static_cast<Js::ArgSlot>(paramSlotNum));
                    val = NewGenericValue(parameterType);
                    opnd->SetValueType(val->GetValueInfo()->Type());
                    return val;
                }
            }
            return nullptr;
        }

        if (!sym->IsPropertySym())
        {
            break;
        }
        originalPropertySym = sym->AsPropertySym();

        // Don't give a value to 'arguments' property sym to prevent field copy prop of 'arguments'
        if (originalPropertySym->AsPropertySym()->m_propertyId == Js::PropertyIds::arguments &&
            originalPropertySym->AsPropertySym()->m_fieldKind == PropertyKindData)
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }

        Value *const objectValue = CurrentBlockData()->FindValue(originalPropertySym->m_stackSym);
        opnd->AsSymOpnd()->SetPropertyOwnerValueType(
            objectValue ? objectValue->GetValueInfo()->Type() : ValueType::Uninitialized);

        
        sym = this->CopyPropPropertySymObj(opnd->AsSymOpnd(), instr);

        if (!DoFieldCopyProp())
        {
            if (opnd->AsSymOpnd()->IsPropertySymOpnd())
            {
                this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
            }
            return nullptr;
        }
        switch (instr->m_opcode)
        {
            // These need the symbolic reference to the field, don't copy prop the value of the field
        case Js::OpCode::DeleteFld:
        case Js::OpCode::DeleteRootFld:
        case Js::OpCode::DeleteFldStrict:
        case Js::OpCode::DeleteRootFldStrict:
        case Js::OpCode::ScopedDeleteFld:
        case Js::OpCode::ScopedDeleteFldStrict:
        case Js::OpCode::LdMethodFromFlags:
        case Js::OpCode::BrOnNoProperty:
        case Js::OpCode::BrOnNoLocalProperty:
        case Js::OpCode::BrOnHasProperty:
        case Js::OpCode::BrOnHasLocalProperty:
        case Js::OpCode::LdMethodFldPolyInlineMiss:
        case Js::OpCode::StSlotChkUndecl:
        case Js::OpCode::ScopedLdInst:
            return nullptr;
        };

        if (instr->CallsGetter())
        {
            return nullptr;
        }

        if (this->IsLoopPrePass() && this->DoFieldPRE(this->rootLoopPrePass))
        {
            if (!this->prePassLoop->allFieldsKilled && !this->prePassLoop->fieldKilled->Test(sym->m_id))
            {
                this->SetLoopFieldInitialValue(this->rootLoopPrePass, instr, sym->AsPropertySym(), originalPropertySym);
            }
            if (this->IsPREInstrCandidateLoad(instr->m_opcode))
            {
                // Foreach property sym, remember the first instruction that loads it.
                // Can this be done in one call?
                if (!this->prePassInstrMap->ContainsKey(sym->m_id))
                {
                    this->prePassInstrMap->AddNew(sym->m_id, instr->CopyWithoutDst());
                }
            }
        }
        break; 
    }
    case IR::OpndKindReg:
        // Clear the opnd's value type up-front, so that this code cannot accidentally use the value type set from a previous
        // OptSrc on the same instruction (for instance, from an earlier loop prepass). The value type will be set from the
        // value if available, before returning from this function.
        opnd->SetValueType(ValueType::Uninitialized);

        sym = opnd->AsRegOpnd()->m_sym;
        CurrentBlockData()->MarkTempLastUse(instr, opnd->AsRegOpnd());
        if (sym->AsStackSym()->IsTypeSpec())
        {
            sym = sym->AsStackSym()->GetVarEquivSym(this->func);
        }
        break;

    case IR::OpndKindIndir:
        this->OptimizeIndirUses(opnd->AsIndirOpnd(), &instr, indirIndexValRef);
        return nullptr;

    default:
        return nullptr;
    }

    val = CurrentBlockData()->FindValue(sym);

    if (val)
    {
        Assert(CurrentBlockData()->IsLive(sym) || (sym->IsPropertySym()));
        if (instr)
        {
            opnd = this->CopyProp(opnd, instr, val, parentIndirOpnd);
        }

        // Check if we freed the operand.
        if (opnd == nullptr)
        {
            return nullptr;
        }

        // In a loop prepass, determine stack syms that are used before they are defined in the root loop for which the prepass
        // is being done. This information is used to do type specialization conversions in the landing pad where appropriate.
        if(IsLoopPrePass() &&
            sym->IsStackSym() &&
            !rootLoopPrePass->symsUsedBeforeDefined->Test(sym->m_id) &&
            rootLoopPrePass->landingPad->globOptData.IsLive(sym) && !isAsmJSFunc) // no typespec in asmjs and hence skipping this
        {
            Value *const landingPadValue = rootLoopPrePass->landingPad->globOptData.FindValue(sym);
            if(landingPadValue && val->GetValueNumber() == landingPadValue->GetValueNumber())
            {
                rootLoopPrePass->symsUsedBeforeDefined->Set(sym->m_id);
                ValueInfo *landingPadValueInfo = landingPadValue->GetValueInfo();
                if(landingPadValueInfo->IsLikelyNumber())
                {
                    rootLoopPrePass->likelyNumberSymsUsedBeforeDefined->Set(sym->m_id);
                    if(DoAggressiveIntTypeSpec() ? landingPadValueInfo->IsLikelyInt() : landingPadValueInfo->IsInt())
                    {
                        // Can only force int conversions in the landing pad based on likely-int values if aggressive int type
                        // specialization is enabled.
                        rootLoopPrePass->likelyIntSymsUsedBeforeDefined->Set(sym->m_id);
                    }
                }
            }
        }
    }
    else if ((instr->TransfersSrcValue() || OpCodeAttr::CanCSE(instr->m_opcode)) && (opnd == instr->GetSrc1() || opnd == instr->GetSrc2()))
    {
        if (sym->IsPropertySym())
        {
            val = this->CreateFieldSrcValue(sym->AsPropertySym(), originalPropertySym, &opnd, instr);
        }
        else
        {
            val = this->NewGenericValue(ValueType::Uninitialized, opnd);
        }
    }

    if (opnd->IsSymOpnd() && opnd->AsSymOpnd()->IsPropertySymOpnd())
    {
        TryOptimizeInstrWithFixedDataProperty(&instr);
        this->FinishOptPropOp(instr, opnd->AsPropertySymOpnd());
    }

    if (val)
    {
        ValueType valueType(val->GetValueInfo()->Type());

        // This block uses per-instruction profile information on array types to optimize using the best available profile
        // information and to prevent infinite bailouts by ensuring array type information is updated on bailouts.
        if (valueType.IsLikelyArray() && !valueType.IsDefinite() && !valueType.IsObject() && instr->IsProfiledInstr())
        {
            // See if we have profile data for the array type
            IR::ProfiledInstr *const profiledInstr = instr->AsProfiledInstr();
            ValueType profiledArrayType;

            bool useAggressiveSpecialization = true;
            switch(instr->m_opcode)
            {
                case Js::OpCode::LdElemI_A:
                    if(instr->GetSrc1()->IsIndirOpnd() && opnd == instr->GetSrc1()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::StElemI_A:
                case Js::OpCode::StElemI_A_Strict:
                case Js::OpCode::StElemC:
                    if(instr->GetDst()->IsIndirOpnd() && opnd == instr->GetDst()->AsIndirOpnd()->GetBaseOpnd())
                    {
                        profiledArrayType = profiledInstr->u.stElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.stElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::LdLen_A:
                    if(instr->GetSrc1()->IsRegOpnd() && opnd == instr->GetSrc1())
                    {
                        profiledArrayType = profiledInstr->u.LdLenInfo().GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.LdLenInfo().IsAggressiveSpecializationDisabled();
                    }
                    break;

                case Js::OpCode::IsIn:
                    if (instr->GetSrc2()->IsRegOpnd() && opnd == instr->GetSrc2())
                    {
                        profiledArrayType = profiledInstr->u.ldElemInfo->GetArrayType();
                        useAggressiveSpecialization = !profiledInstr->u.ldElemInfo->IsAggressiveSpecializationDisabled();
                    }
                    break;
            }

            if (profiledArrayType.IsLikelyObject())
            {
                // Ideally we want to use the most specialized type seen by this path, but when that causes bailouts use the least specialized type instead.
                if (useAggressiveSpecialization && 
                    profiledArrayType.GetObjectType() == valueType.GetObjectType() &&
                    !valueType.IsLikelyNativeIntArray() &&
                    (
                        profiledArrayType.HasIntElements() || (valueType.HasVarElements() && profiledArrayType.HasFloatElements())
                    ))
                {
                    // use the more specialized type profiled by the instruction.
                    valueType = profiledArrayType.SetHasNoMissingValues(valueType.HasNoMissingValues());
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false);
                }
                else if (!useAggressiveSpecialization && 
                    (profiledArrayType.GetObjectType() != valueType.GetObjectType() ||
                        (
                            valueType.IsLikelyNativeArray() &&
                            (
                                profiledArrayType.HasVarElements() || (valueType.HasIntElements() && profiledArrayType.HasFloatElements())
                            )
                        )
                    ))
                {
                    // Merge array type we pulled from profile with type propagated by dataflow.
                    if (profiledArrayType.IsLikelyArray())
                    {
                        valueType = valueType.Merge(profiledArrayType).SetHasNoMissingValues(valueType.HasNoMissingValues());
                    }
                    else
                    {
                        valueType = valueType.Merge(profiledArrayType);
                    }
                    ChangeValueType(this->currentBlock, CurrentBlockData()->FindValue(opnd->AsRegOpnd()->m_sym), valueType, false, true);
                }
            }
        }

        opnd->SetValueType(valueType);

        if(!IsLoopPrePass() && opnd->IsSymOpnd() && (valueType.IsDefinite() || valueType.IsNotTaggedValue()))
        {
            if (opnd->AsSymOpnd()->m_sym->IsPropertySym())
            {
                // A property sym can only be guaranteed to have a definite value type when implicit calls are disabled from the
                // point where the sym was defined with the definite value type. Insert an instruction to indicate to the
                // dead-store pass that implicit calls need to be kept disabled until after this instruction.
                Assert(DoFieldCopyProp());
                CaptureNoImplicitCallUses(opnd, false, instr);
            }
        }
    }
    else
    {
        opnd->SetValueType(ValueType::Uninitialized);
    }

    return val;
}